

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O1

void __thiscall Minisat::Solver::cancelUntilTrailRecord(Solver *this)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  
  iVar1 = (this->trail).sz;
  lVar3 = (long)iVar1;
  iVar4 = this->trailRecord;
  if (iVar4 < iVar1) {
    do {
      lVar2 = lVar3 + -1;
      lVar3 = lVar3 + -1;
      (this->assigns).data[(this->trail).data[lVar2].x >> 1].value = '\x02';
      iVar4 = this->trailRecord;
    } while (iVar4 < lVar3);
  }
  this->qhead = iVar4;
  if (iVar4 < (this->trail).sz) {
    (this->trail).sz = iVar4;
  }
  return;
}

Assistant:

int size(void) const { return sz; }